

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

BigInteger * __thiscall BigInteger::operator-=(BigInteger *this,BigInteger *a)

{
  BigInteger *in_RSI;
  BigInteger *in_RDI;
  BigInteger *in_stack_00000098;
  BigInteger *in_stack_000000a0;
  
  in_RDI->negative = (in_RDI->negative & 1U) != 1;
  operator+=(in_stack_000000a0,in_stack_00000098);
  in_RDI->negative = (in_RDI->negative & 1U) != 1;
  normalize(in_RSI);
  return in_RDI;
}

Assistant:

BigInteger &BigInteger::operator-=(const BigInteger &a) noexcept
{
    negative ^= 1;
    *this += a;
    negative ^= 1;
    normalize();
    return *this;
}